

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem_helper.c
# Opt level: O1

uint32_t helper_mvst(CPUS390XState_conflict *env,uint32_t r1,uint32_t r2)

{
  ulong uVar1;
  uint8_t byte;
  uint uVar2;
  ulong vaddr;
  long lVar3;
  ulong uVar4;
  int size;
  ulong uVar5;
  int mmu_idx;
  uintptr_t unaff_retaddr;
  S390Access local_80;
  S390Access local_58;
  
  uVar1 = (env->psw).mask;
  mmu_idx = 3;
  if ((uVar1 >> 0x3a & 1) != 0) {
    switch((uint)(uVar1 >> 0x2e) & 3) {
    case 0:
      mmu_idx = 0;
      break;
    case 1:
      abort();
    case 2:
      mmu_idx = 1;
      break;
    case 3:
      mmu_idx = 2;
    }
  }
  uVar4 = env->regs[(int)r1];
  if ((uVar1 >> 0x20 & 1) == 0) {
    if ((int)uVar1 < 0) {
      uVar4 = (ulong)((uint)uVar4 & 0x7fffffff);
    }
    else {
      uVar4 = (ulong)((uint)uVar4 & 0xffffff);
    }
  }
  vaddr = env->regs[(int)r2];
  if ((uVar1 & 0x100000000) == 0) {
    if ((int)uVar1 < 0) {
      vaddr = (ulong)((uint)vaddr & 0x7fffffff);
    }
    else {
      vaddr = (ulong)((uint)vaddr & 0xffffff);
    }
  }
  uVar1 = env->regs[0];
  uVar5 = -(vaddr | 0xfffffffffffff000);
  if (-(uVar4 | 0xfffffffffffff000) < -(vaddr | 0xfffffffffffff000)) {
    uVar5 = -(uVar4 | 0xfffffffffffff000);
  }
  if ((uVar1 & 0xffffff00) == 0) {
    lVar3 = 0;
    size = (int)uVar5;
    access_prepare(&local_58,env,vaddr,size,MMU_DATA_LOAD,mmu_idx,unaff_retaddr);
    access_prepare(&local_80,env,uVar4,size,MMU_DATA_STORE,mmu_idx,unaff_retaddr);
    do {
      byte = access_get_byte(env,&local_58,(int)lVar3,unaff_retaddr);
      access_set_byte(env,&local_80,(int)lVar3,byte,unaff_retaddr);
      if (byte == (uint8_t)uVar1) {
        uVar1 = (env->psw).mask;
        if ((uVar1 & 0x100000000) == 0) {
          uVar2 = 0x7fffffff;
          if (-1 < (int)uVar1) {
            uVar2 = 0xffffff;
          }
          *(uint *)(env->regs + (int)r1) = (uint)(uVar4 + lVar3) & uVar2;
        }
        else {
          env->regs[(int)r1] = uVar4 + lVar3;
        }
        return 1;
      }
      lVar3 = lVar3 + 1;
    } while (size != (int)lVar3);
    uVar4 = uVar4 + uVar5;
    uVar1 = (env->psw).mask;
    if ((uVar1 & 0x100000000) == 0) {
      uVar2 = 0x7fffffff;
      if (-1 < (int)uVar1) {
        uVar2 = 0xffffff;
      }
      uVar4 = (ulong)((uint)uVar4 & uVar2) | env->regs[(int)r1] & 0xffffffff00000000;
    }
    env->regs[(int)r1] = uVar4;
    uVar1 = (env->psw).mask;
    if ((uVar1 & 0x100000000) == 0) {
      uVar2 = 0x7fffffff;
      if (-1 < (int)uVar1) {
        uVar2 = 0xffffff;
      }
      env->regs[(int)r2] =
           env->regs[(int)r2] & 0xffffffff00000000 | (ulong)((uint)(uVar5 + vaddr) & uVar2);
    }
    else {
      env->regs[(int)r2] = uVar5 + vaddr;
    }
    return 3;
  }
  tcg_s390_program_interrupt_s390x(env,6,unaff_retaddr);
}

Assistant:

uint32_t HELPER(mvst)(CPUS390XState *env, uint32_t r1, uint32_t r2)
{
    const int mmu_idx = cpu_mmu_index(env, false);
    const uint64_t d = get_address(env, r1);
    const uint64_t s = get_address(env, r2);
    const uint8_t c = env->regs[0];
    const int len = MIN(-(d | TARGET_PAGE_MASK), -(s | TARGET_PAGE_MASK));
    S390Access srca, desta;
    uintptr_t ra = GETPC();
    int i;

    if (env->regs[0] & 0xffffff00ull) {
        tcg_s390_program_interrupt(env, PGM_SPECIFICATION, ra);
    }

    /*
     * Our access should not exceed single pages, as we must not report access
     * exceptions exceeding the actually copied range (which we don't know at
     * this point). We might over-indicate watchpoints within the pages
     * (if we ever care, we have to limit processing to a single byte).
     */
    srca = access_prepare(env, s, len, MMU_DATA_LOAD, mmu_idx, ra);
    desta = access_prepare(env, d, len, MMU_DATA_STORE, mmu_idx, ra);
    for (i = 0; i < len; i++) {
        const uint8_t v = access_get_byte(env, &srca, i, ra);

        access_set_byte(env, &desta, i, v, ra);
        if (v == c) {
            set_address_zero(env, r1, d + i);
            return 1;
        }
    }
    set_address_zero(env, r1, d + len);
    set_address_zero(env, r2, s + len);
    return 3;
}